

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O0

void __thiscall
QSslKey::QSslKey(QSslKey *this,QIODevice *device,KeyAlgorithm algorithm,EncodingFormat encoding,
                KeyType type,QByteArray *passPhrase)

{
  QByteArray *this_00;
  pointer pTVar1;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  QSslKeyPrivate *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  TlsKey *tlsKey;
  QByteArray encoded;
  QSslKeyPrivate *in_stack_ffffffffffffff98;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QByteArray *)operator_new(0x10);
  QSslKeyPrivate::QSslKeyPrivate(in_stack_ffffffffffffff98);
  QExplicitlySharedDataPointer<QSslKeyPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QSslKeyPrivate> *)this_00,in_RDI);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x39e1ce);
  if (in_RSI != 0) {
    QIODevice::readAll();
    QByteArray::operator=(this_00,(QByteArray *)in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x39e1fe);
  }
  QExplicitlySharedDataPointer<QSslKeyPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslKeyPrivate> *)0x39e207);
  pTVar1 = std::unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>::get
                     ((unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_> *)
                      0x39e20f);
  if (pTVar1 != (pointer)0x0) {
    if (in_ECX == 1) {
      (*pTVar1->_vptr_TlsKey[2])(pTVar1,(ulong)in_R8D,(ulong)in_EDX,&local_20,in_R9,1);
    }
    else {
      (*pTVar1->_vptr_TlsKey[3])(pTVar1,(ulong)in_R8D,(ulong)in_EDX,&local_20,in_R9,1);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x39e277);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSslKey::QSslKey(QIODevice *device, QSsl::KeyAlgorithm algorithm, QSsl::EncodingFormat encoding,
                 QSsl::KeyType type, const QByteArray &passPhrase)
    : d(new QSslKeyPrivate)
{
    QByteArray encoded;
    if (device)
        encoded = device->readAll();

    if (auto *tlsKey = d->backend.get()) {
        if (encoding == QSsl::Der)
            tlsKey->decodeDer(type, algorithm, encoded, passPhrase, true /*deep clear*/);
        else
            tlsKey->decodePem(type, algorithm, encoded, passPhrase, true /*deep clear*/);
    }
}